

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

work_t __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,long i,long k,int j)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (i < 1) {
    i = 0;
  }
  lVar4 = this->width + -1;
  if (i < lVar4) {
    lVar4 = i;
  }
  if (k < 1) {
    k = 0;
  }
  lVar3 = this->height + -1;
  if (k < lVar3) {
    lVar3 = k;
  }
  iVar1 = 0;
  if (0 < j) {
    iVar1 = j;
  }
  iVar2 = this->depth + -1;
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  return (work_t)this->img[iVar2][lVar3][lVar4];
}

Assistant:

work_t getBounds(long i, long k, int j=0) const
    {
      i=std::max(0l, i);
      i=std::min(width-1, i);

      k=std::max(0l, k);
      k=std::min(height-1, k);

      j=std::max(0, j);
      j=std::min(depth-1, j);

      return static_cast<work_t>(img[j][k][i]);
    }